

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O3

w3Limits __thiscall w3Module::read_limits(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined8 extraout_RDX;
  w3Limits wVar6;
  string local_48;
  
  bVar1 = ::read_byte(cursor,this->end);
  if (bVar1 < 2) {
    uVar2 = ::read_varuint32(cursor,this->end);
    if (bVar1 == 1) {
      uVar3 = ::read_varuint32(cursor,this->end);
      uVar4 = (ulong)uVar3 << 0x20;
      uVar5 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_0010ffb0;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"invalid limit tag","");
    ThrowString(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    uVar2 = ::read_varuint32(cursor,this->end);
  }
  uVar5 = 0;
  uVar4 = 0;
LAB_0010ffb0:
  wVar6._8_4_ = uVar5;
  wVar6.min = (int)(uVar2 | uVar4);
  wVar6.max = (int)((uVar2 | uVar4) >> 0x20);
  return wVar6;
}

Assistant:

w3Limits w3Module::read_limits (uint8_t** cursor)
{
    w3Limits limits;
    const uint32_t tag = read_byte (cursor);
    switch (tag)
    {
    case 0:
    case 1:
        break;
    default:
        ThrowString ("invalid limit tag");
        break;
    }
    limits.hasMax = (tag == 1);
    limits.min = read_varuint32 (cursor);
    if (limits.hasMax)
        limits.max = read_varuint32 (cursor);
    return limits;
}